

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

void int_linear(vec<int> *a,vec<IntVar_*> *x,IntRelType t,int c,BoolView *r)

{
  FILE *__stream;
  bool bVar1;
  bool bVar2;
  IntRelType IVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  char *pcVar7;
  int in_ECX;
  IntRelType in_EDX;
  vec<IntVar_*> *in_RSI;
  BoolView *in_RDI;
  IntVar *x_00;
  int in_stack_00000094;
  BoolView *in_stack_00000098;
  int in_stack_000000a0;
  IntRelType in_stack_000000a4;
  undefined4 in_stack_000000a8;
  IntRelType in_stack_000000ac;
  IntVar *in_stack_000000b0;
  uint i;
  double limit;
  bool scale;
  BoolView *in_stack_fffffffffffffe88;
  BoolView *in_stack_fffffffffffffe90;
  BoolView *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  IntRelType in_stack_fffffffffffffeec;
  IntVar *in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff50;
  IntVar *in_stack_ffffffffffffff58;
  IntVar *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff70;
  vec<IntVar_*> *in_stack_ffffffffffffff78;
  vec<int> *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff98;
  IntRelType in_stack_ffffffffffffff9c;
  IntVar *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffbc;
  IntVar *in_stack_ffffffffffffffc0;
  IntRelType t_00;
  IntRelType t_01;
  
  bVar1 = false;
  if (in_ECX < 1) {
    in_ECX = -in_ECX;
  }
  x_00 = (IntVar *)(double)in_ECX;
  t_00 = IRT_EQ;
  while (t_01 = t_00, IVar3 = vec<IntVar_*>::size(in_RSI), __stream = _stderr, t_00 < IVar3) {
    piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,t_01);
    if ((*piVar6 != 1) && (piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,t_01), *piVar6 != -1)) {
      bVar1 = true;
    }
    piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,t_01);
    iVar4 = *piVar6;
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    x_00 = (IntVar *)((double)(iVar4 * 500000000 + 0x7fffffff) + (double)x_00);
    t_00 = t_01 + IRT_NE;
  }
  if (9.223372036854776e+18 <= (double)x_00) {
    pcVar7 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/linear.cpp"
                     ,0x2f);
    if (pcVar7 == (char *)0x0) {
      pcVar7 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/linear.cpp"
      ;
    }
    else {
      pcVar7 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/linear.cpp"
                       ,0x2f);
      pcVar7 = pcVar7 + 1;
    }
    fprintf(__stream,"%s:%d: ",pcVar7,0x1d4);
    fprintf(_stderr,"Linear constraint may overflow, not yet supported\n");
    abort();
  }
  uVar5 = vec<IntVar_*>::size(in_RSI);
  if ((uVar5 == 1) && (!bVar1)) {
    bVar1 = BoolView::isTrue(in_stack_fffffffffffffe90);
    if (bVar1) {
      piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,0);
      if (*piVar6 == 1) {
        vec<IntVar_*>::operator[](in_RSI,0);
        int_rel(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      }
      piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,0);
      if (*piVar6 != -1) {
        return;
      }
      vec<IntVar_*>::operator[](in_RSI,0);
      operator-(in_EDX);
      int_rel(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      return;
    }
    piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,0);
    if (*piVar6 == 1) {
      vec<IntVar_*>::operator[](in_RSI,0);
      BoolView::BoolView(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      int_rel_reif(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                   in_stack_fffffffffffffee0);
      BoolView::~BoolView((BoolView *)0x2609b2);
    }
    piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,0);
    if (*piVar6 != -1) {
      return;
    }
    vec<IntVar_*>::operator[](in_RSI,0);
    operator-(in_EDX);
    BoolView::BoolView(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    int_rel_reif(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                 in_stack_fffffffffffffee0);
    BoolView::~BoolView((BoolView *)0x260a7e);
    return;
  }
  uVar5 = vec<IntVar_*>::size(in_RSI);
  if ((uVar5 == 2) && (!bVar1)) {
    bVar2 = BoolView::isTrue(in_stack_fffffffffffffe90);
    if (bVar2) {
      piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,0);
      if (((*piVar6 == -1) && (piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,1), *piVar6 == -1))
         && (in_EDX != IRT_NE)) {
        vec<IntVar_*>::operator[](in_RSI,0);
        vec<IntVar_*>::operator[](in_RSI,1);
        operator-(in_EDX);
        bin_linear(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   (IntRelType)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                   (int)in_stack_ffffffffffffff50);
        return;
      }
      piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,0);
      if ((*piVar6 == 1) && (piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,1), *piVar6 == -1)) {
        vec<IntVar_*>::operator[](in_RSI,0);
        vec<IntVar_*>::operator[](in_RSI,1);
        int_rel(x_00,t_01,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        return;
      }
      piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,0);
      if ((*piVar6 == -1) && (piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,1), *piVar6 == 1)) {
        vec<IntVar_*>::operator[](in_RSI,1);
        vec<IntVar_*>::operator[](in_RSI,0);
        int_rel(x_00,t_01,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        return;
      }
      piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,0);
      if (((*piVar6 == 1) && (piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,1), *piVar6 == 1)) &&
         (in_EDX != IRT_NE)) {
        vec<IntVar_*>::operator[](in_RSI,0);
        vec<IntVar_*>::operator[](in_RSI,1);
        bin_linear(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   (IntRelType)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                   (int)in_stack_ffffffffffffff50);
        return;
      }
    }
    else {
      piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,0);
      iVar4 = *piVar6;
      piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,1);
      if (iVar4 + *piVar6 == 0) {
        piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,0);
        if ((*piVar6 == 1) && (piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,1), *piVar6 == -1))
        {
          vec<IntVar_*>::operator[](in_RSI,0);
          vec<IntVar_*>::operator[](in_RSI,1);
          int_rel_reif(in_stack_000000b0,in_stack_000000ac,
                       (IntVar *)CONCAT44(in_stack_000000a4,in_stack_000000a0),in_stack_00000098,
                       in_stack_00000094);
        }
        piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,0);
        if (*piVar6 != -1) {
          return;
        }
        piVar6 = vec<int>::operator[]((vec<int> *)in_RDI,1);
        if (*piVar6 != 1) {
          return;
        }
        vec<IntVar_*>::operator[](in_RSI,1);
        vec<IntVar_*>::operator[](in_RSI,0);
        int_rel_reif(in_stack_000000b0,in_stack_000000ac,
                     (IntVar *)CONCAT44(in_stack_000000a4,in_stack_000000a0),in_stack_00000098,
                     in_stack_00000094);
        return;
      }
    }
  }
  bVar2 = BoolView::isTrue(in_stack_fffffffffffffe90);
  if (bVar2) {
    if (bVar1) {
      int_linear<1>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,t_00,
                    in_stack_ffffffffffffff70);
    }
    else {
      int_linear<0>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,t_00,
                    in_stack_ffffffffffffff70);
    }
  }
  else if (bVar1) {
    BoolView::BoolView(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    int_linear_reif<1>((vec<int> *)in_stack_000000b0,
                       (vec<IntVar_*> *)CONCAT44(in_stack_000000ac,in_stack_000000a8),
                       in_stack_000000a4,in_stack_000000a0,in_stack_00000098);
    BoolView::~BoolView((BoolView *)0x260f3e);
  }
  else {
    BoolView::BoolView(in_RDI,in_stack_fffffffffffffe88);
    int_linear_reif<0>((vec<int> *)in_stack_000000b0,
                       (vec<IntVar_*> *)CONCAT44(in_stack_000000ac,in_stack_000000a8),
                       in_stack_000000a4,in_stack_000000a0,in_stack_00000098);
    BoolView::~BoolView((BoolView *)0x260fde);
  }
  return;
}

Assistant:

void int_linear(vec<int>& a, vec<IntVar*>& x, IntRelType t, int c, const BoolView& r) {
	assert(a.size() == x.size());

	bool scale = false;
	double limit = abs(c);
	for (unsigned int i = 0; i < x.size(); i++) {
		assert(a[i]);
		if (a[i] != 1 && a[i] != -1) {
			scale = true;
		}
		limit += abs(a[i]) * IntVar::max_limit + INT_MAX;
	}
	if (limit >= INT64_MAX) {
		CHUFFED_ERROR("Linear constraint may overflow, not yet supported\n");
	}

	if (x.size() == 1 && !scale) {
		if (r.isTrue()) {
			if (a[0] == 1) {
				int_rel(x[0], t, c);
			}
			if (a[0] == -1) {
				int_rel(x[0], -t, -c);
			}
		} else {
			if (a[0] == 1) {
				int_rel_reif(x[0], t, c, r);
			}
			if (a[0] == -1) {
				int_rel_reif(x[0], -t, -c, r);
			}
		}
		return;
	}

	if (x.size() == 2 && !scale) {
		if (r.isTrue()) {
			if (a[0] == -1 && a[1] == -1 && t != IRT_NE) {
				bin_linear(x[0], x[1], -t, -c);
				return;
			}
			if (a[0] == 1 && a[1] == -1) {
				int_rel(x[0], t, x[1], c);
				return;
			}
			if (a[0] == -1 && a[1] == 1) {
				int_rel(x[1], t, x[0], c);
				return;
			}
			if (a[0] == 1 && a[1] == 1 && t != IRT_NE) {
				bin_linear(x[0], x[1], t, c);
				return;
			}
		} else if (a[0] + a[1] == 0) {
			if (a[0] == 1 && a[1] == -1) {
				int_rel_reif(x[0], t, x[1], r, c);
			}
			if (a[0] == -1 && a[1] == 1) {
				int_rel_reif(x[1], t, x[0], r, c);
			}
			return;
		}
	}

	if (r.isTrue()) {
		if (scale) {
			int_linear<1>(a, x, t, c);
		} else {
			int_linear<0>(a, x, t, c);
		}
	} else {
		if (scale) {
			int_linear_reif<1>(a, x, t, c, r);
		} else {
			int_linear_reif<0>(a, x, t, c, r);
		}
	}
}